

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_conf.cc
# Opt level: O2

X509_EXTENSION * v3_generic_extension(char *ext,char *value,int crit,int gen_type,X509V3_CTX *ctx)

{
  uint uVar1;
  _Head_base<0UL,_asn1_string_st_*,_false> __p;
  ASN1_TYPE *a;
  tuple<asn1_string_st_*,_bssl::internal::Deleter> str;
  X509_EXTENSION *pXVar2;
  size_t ext_len;
  UniquePtr<unsigned_char> ext_der;
  UniquePtr<ASN1_OCTET_STRING> oct;
  UniquePtr<ASN1_OBJECT> obj;
  
  obj._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<asn1_object_st,_bssl::internal::Deleter,_true,_true>)OBJ_txt2obj(ext,0);
  if ((tuple<asn1_object_st_*,_bssl::internal::Deleter>)
      obj._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_asn1_object_st_*,_false>)0x0) {
    pXVar2 = (X509_EXTENSION *)0x0;
    ERR_put_error(0x14,0,0x71,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                  ,0xe7);
    ERR_add_error_data(2,"name=",ext);
    goto LAB_0040fafe;
  }
  ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0;
  ext_len = 0;
  if (gen_type == 2) {
    a = ASN1_generate_v3(value,(X509V3_CTX *)ctx);
    if (a != (ASN1_TYPE *)0x0) {
      oct._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>)0x0;
      uVar1 = i2d_ASN1_TYPE(a,(uchar **)&oct);
      ASN1_TYPE_free(a);
      if (-1 < (int)uVar1) {
        ext_len = (size_t)uVar1;
        __p._M_head_impl = (asn1_string_st *)oct;
        goto LAB_0040fa3d;
      }
    }
    __p._M_head_impl = (asn1_string_st *)0x0;
LAB_0040fa3d:
    std::__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter> *)&ext_der,
               (pointer)__p._M_head_impl);
    if ((__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)
        ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0) goto LAB_0040fa78;
    if (ext_len >> 0x1f == 0) {
      str.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>)ASN1_OCTET_STRING_new();
      oct._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           str.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl;
      if (str.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        pXVar2 = (X509_EXTENSION *)0x0;
      }
      else {
        ASN1_STRING_set0((ASN1_STRING *)
                         str.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,
                         (void *)ext_der._M_t.
                                 super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
                                 super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
                                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl,
                         (int)ext_len);
        ext_der._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
             (__uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>)0x0;
        pXVar2 = X509_EXTENSION_create_by_OBJ
                           ((X509_EXTENSION **)0x0,
                            (ASN1_OBJECT *)
                            obj._M_t.super___uniq_ptr_impl<asn1_object_st,_bssl::internal::Deleter>.
                            _M_t.super__Tuple_impl<0UL,_asn1_object_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_asn1_object_st_*,_false>._M_head_impl,crit,
                            (ASN1_OCTET_STRING *)
                            str.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl);
      }
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&oct);
    }
    else {
      pXVar2 = (X509_EXTENSION *)0x0;
      ERR_put_error(0x14,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                    ,0xfb);
    }
  }
  else {
    if (gen_type == 1) {
      __p._M_head_impl = (asn1_string_st *)x509v3_hex_to_bytes(value,&ext_len);
      goto LAB_0040fa3d;
    }
LAB_0040fa78:
    pXVar2 = (X509_EXTENSION *)0x0;
    ERR_put_error(0x14,0,0x74,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_conf.cc"
                  ,0xf5);
    ERR_add_error_data(2,"value=",value);
  }
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&ext_der);
LAB_0040fafe:
  std::unique_ptr<asn1_object_st,_bssl::internal::Deleter>::~unique_ptr(&obj);
  return (X509_EXTENSION *)pXVar2;
}

Assistant:

static X509_EXTENSION *v3_generic_extension(const char *ext, const char *value,
                                            int crit, int gen_type,
                                            const X509V3_CTX *ctx) {
  bssl::UniquePtr<ASN1_OBJECT> obj(OBJ_txt2obj(ext, 0));
  if (obj == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_NAME_ERROR);
    ERR_add_error_data(2, "name=", ext);
    return nullptr;
  }

  bssl::UniquePtr<unsigned char> ext_der;
  size_t ext_len = 0;
  if (gen_type == 1) {
    ext_der.reset(x509v3_hex_to_bytes(value, &ext_len));
  } else if (gen_type == 2) {
    ext_der.reset(generic_asn1(value, ctx, &ext_len));
  }

  if (ext_der == nullptr) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_EXTENSION_VALUE_ERROR);
    ERR_add_error_data(2, "value=", value);
    return nullptr;
  }

  if (ext_len > INT_MAX) {
    OPENSSL_PUT_ERROR(X509V3, ERR_R_OVERFLOW);
    return nullptr;
  }

  bssl::UniquePtr<ASN1_OCTET_STRING> oct(ASN1_OCTET_STRING_new());
  if (oct == nullptr) {
    return nullptr;
  }

  ASN1_STRING_set0(oct.get(), ext_der.get(), (int)ext_len);
  ext_der.release();  // ASN1_STRING_set0 took ownership.

  return X509_EXTENSION_create_by_OBJ(nullptr, obj.get(), crit, oct.get());
}